

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportedUgridFactory.h
# Opt level: O2

void Parfait::ImportedUgridFactory::createBoundaryConditionsFromTags
               (string *filename,vector<int,_std::allocator<int>_> *triangleTags,
               vector<int,_std::allocator<int>_> *quadTags,
               vector<int,_std::allocator<int>_> *triangleBoundaryConditions,
               vector<int,_std::allocator<int>_> *quadBoundaryConditions)

{
  pointer piVar1;
  int *piVar2;
  long lVar3;
  int *piVar4;
  string mapbcFile;
  MapbcReader reader;
  int local_d4;
  string local_d0 [32];
  vector<int,_std::allocator<int>_> *local_b0;
  string local_a8;
  MapbcReader local_88;
  
  std::__cxx11::string::string(local_d0,(string *)filename);
  std::__cxx11::string::resize((ulong)local_d0);
  lVar3 = std::__cxx11::string::find((char *)local_d0,0x10c305);
  if (lVar3 != -1) {
    std::__cxx11::string::resize((ulong)local_d0);
  }
  lVar3 = std::__cxx11::string::find((char *)local_d0,0x10c252);
  if (lVar3 != -1) {
    std::__cxx11::string::resize((ulong)local_d0);
  }
  std::__cxx11::string::append((char *)local_d0);
  std::__cxx11::string::string((string *)&local_a8,local_d0);
  MapbcReader::MapbcReader(&local_88,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  piVar1 = (triangleBoundaryConditions->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((triangleBoundaryConditions->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (triangleBoundaryConditions->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  std::vector<int,_std::allocator<int>_>::reserve
            (triangleBoundaryConditions,
             (long)(triangleTags->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(triangleTags->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  piVar1 = (quadBoundaryConditions->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((quadBoundaryConditions->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (quadBoundaryConditions->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  std::vector<int,_std::allocator<int>_>::reserve
            (quadBoundaryConditions,
             (long)(quadTags->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(quadTags->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  piVar2 = (triangleTags->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_b0 = quadTags;
  for (piVar4 = (triangleTags->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start; piVar4 != piVar2; piVar4 = piVar4 + 1) {
    local_d4 = MapbcReader::boundaryCondition(&local_88,*piVar4);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(triangleBoundaryConditions,&local_d4);
  }
  piVar2 = (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  for (piVar4 = (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start; piVar4 != piVar2; piVar4 = piVar4 + 1) {
    local_d4 = MapbcReader::boundaryCondition(&local_88,*piVar4);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(quadBoundaryConditions,&local_d4);
  }
  MapbcReader::~MapbcReader(&local_88);
  std::__cxx11::string::~string(local_d0);
  return;
}

Assistant:

inline void ImportedUgridFactory::createBoundaryConditionsFromTags(
            std::string filename,
            std::vector<int> &triangleTags,
            std::vector<int> &quadTags,
            std::vector<int> &triangleBoundaryConditions,
            std::vector<int> &quadBoundaryConditions
    ) {

        std::string mapbcFile = filename;
        mapbcFile.resize(filename.size() - 5);
        auto position = mapbcFile.find("lb8.");
        if (std::string::npos != position)
            mapbcFile.resize(position);
        position = mapbcFile.find("b8.");
        if (std::string::npos != position)
            mapbcFile.resize(position);
        mapbcFile += "mapbc";
        MapbcReader reader(mapbcFile);

        triangleBoundaryConditions.clear();
        triangleBoundaryConditions.reserve(triangleTags.size());
        quadBoundaryConditions.clear();
        quadBoundaryConditions.reserve(quadTags.size());

        for (int tag:triangleTags)
            triangleBoundaryConditions.push_back(reader.boundaryCondition(tag));
        for (int tag:quadTags)
            quadBoundaryConditions.push_back(reader.boundaryCondition(tag));
    }